

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdef.h
# Opt level: O0

int constrain(int diff,int threshold,int damping)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  int in_EDX;
  size_t *extraout_RDX;
  size_t *extraout_RDX_00;
  size_t *siglen;
  uint in_ESI;
  uint uVar4;
  undefined4 in_register_00000034;
  uint in_EDI;
  size_t in_R8;
  int shift;
  undefined4 local_3c;
  undefined4 local_34;
  undefined4 local_30;
  undefined1 local_1c;
  undefined4 local_4;
  
  if (in_ESI == 0) {
    local_4 = 0;
  }
  else {
    uVar4 = in_ESI;
    iVar2 = get_msb(in_ESI);
    uVar3 = in_EDX - iVar2;
    if ((int)uVar3 < 0) {
      local_1c = 0;
      siglen = extraout_RDX;
    }
    else {
      uVar3 = get_msb(in_ESI);
      local_1c = (char)in_EDX - (char)uVar3;
      siglen = extraout_RDX_00;
    }
    local_4 = sign((EVP_PKEY_CTX *)(ulong)in_EDI,(uchar *)CONCAT44(in_register_00000034,uVar4),
                   siglen,(uchar *)(ulong)uVar3,in_R8);
    uVar3 = in_EDI;
    if ((int)in_EDI < 1) {
      uVar3 = -in_EDI;
    }
    uVar4 = in_EDI;
    if ((int)in_EDI < 1) {
      uVar4 = -in_EDI;
    }
    bVar1 = local_1c & 0x1f;
    if ((int)(in_ESI - ((int)uVar4 >> bVar1)) < 0 >> bVar1) {
      local_30 = 0 >> bVar1;
    }
    else {
      uVar4 = in_EDI;
      if ((int)in_EDI < 1) {
        uVar4 = -in_EDI;
      }
      local_30 = in_ESI - ((int)uVar4 >> (local_1c & 0x1f));
    }
    if ((int)uVar3 < local_30) {
      local_34 = in_EDI;
      if ((int)in_EDI < 1) {
        local_34 = -in_EDI;
      }
    }
    else {
      uVar3 = in_EDI;
      if ((int)in_EDI < 1) {
        uVar3 = -in_EDI;
      }
      bVar1 = local_1c & 0x1f;
      if ((int)(in_ESI - ((int)uVar3 >> bVar1)) < 0 >> bVar1) {
        local_3c = 0 >> bVar1;
      }
      else {
        if ((int)in_EDI < 1) {
          in_EDI = -in_EDI;
        }
        local_3c = in_ESI - ((int)in_EDI >> (local_1c & 0x1f));
      }
      local_34 = local_3c;
    }
    local_4 = local_4 * local_34;
  }
  return local_4;
}

Assistant:

static inline int constrain(int diff, int threshold, int damping) {
  if (!threshold) return 0;

  const int shift = AOMMAX(0, damping - get_msb(threshold));
  return sign(diff) *
         AOMMIN(abs(diff), AOMMAX(0, threshold - (abs(diff) >> shift)));
}